

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O3

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *pBVar4;
  int *piVar5;
  int iVar6;
  undefined1 _index [16];
  bool bVar7;
  int iVar8;
  logic_error *this_00;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  int iVar15;
  char cVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar7 = has_next(this,all_cofacets);
  iVar14 = 0;
  if (!bVar7) {
LAB_00135cc5:
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
    ._M_engaged = SUB41(iVar14,0);
    return __return_storage_ptr__;
  }
  pBVar4 = this->simplex_encoding;
  iVar2 = this->j;
  bVar1 = this->k;
  uVar19 = (ulong)this->idx_below;
  uVar12 = *(ulong *)((long)&this->idx_below + 8);
  lVar18 = *(long *)((long)&this->idx_above + 8);
  uVar17 = (ulong)this->idx_above;
  cVar16 = bVar1 + 1;
  do {
    iVar8 = (uint)bVar1 + iVar14;
    iVar15 = iVar2 + iVar14;
    uVar20 = (ulong)iVar15;
    lVar24 = (long)uVar20 >> 0x3f;
    if ((char)iVar8 == '\0') {
      if (uVar19 == 0 && uVar12 == 0) goto LAB_00135bb5;
      uVar22 = 0;
      uVar21 = 1;
    }
    else {
      uVar11 = ((uint)bVar1 + iVar14 + -1) * pBVar4->bits_per_vertex;
      bVar9 = (byte)uVar11;
      bVar10 = bVar9 & 0x3f;
      uVar22 = uVar20 << (bVar9 & 0x3f);
      bVar7 = (uVar11 & 0x40) != 0;
      uVar21 = lVar24 << bVar10 | uVar20 >> 0x40 - bVar10;
      if (bVar7) {
        uVar21 = uVar22;
      }
      uVar23 = 0;
      if (!bVar7) {
        uVar23 = uVar22;
      }
      if (uVar12 < uVar21 || uVar12 - uVar21 < (ulong)(uVar19 < uVar23)) {
LAB_00135bb5:
        fVar25 = (this->simplex).
                 super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
                 .first;
        piVar13 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar13 != piVar5) {
          do {
            iVar3 = *piVar13;
            if (iVar15 == iVar3) {
              fVar26 = 0.0;
            }
            else {
              iVar6 = iVar3;
              if (iVar3 < iVar15) {
                iVar6 = iVar15;
              }
              if (iVar15 < iVar3) {
                iVar3 = iVar15;
              }
              fVar26 = (this->dist->rows).super__Vector_base<float_*,_std::allocator<float_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar6][iVar3];
            }
            if (fVar26 <= fVar25) {
              fVar26 = fVar25;
            }
            fVar25 = fVar26;
            piVar13 = piVar13 + 1;
          } while (piVar13 != piVar5);
        }
        this->j = iVar2 + iVar14 + -1;
        if (cVar16 == '\0') {
          iVar14 = 0;
          uVar20 = 1;
        }
        else {
          uVar11 = pBVar4->bits_per_vertex * iVar8;
          bVar10 = (byte)uVar11;
          bVar1 = bVar10 & 0x3f;
          uVar21 = uVar20 << (bVar10 & 0x3f);
          bVar7 = (uVar11 & 0x40) != 0;
          uVar20 = lVar24 << bVar1 | uVar20 >> 0x40 - bVar1;
          if (bVar7) {
            uVar20 = uVar21;
          }
          iVar14 = (int)uVar20;
          uVar20 = 0;
          if (!bVar7) {
            uVar20 = uVar21;
          }
        }
        _index._8_8_ = uVar12;
        _index._0_8_ = in_stack_ffffffffffffff88;
        entry_with_coeff_t::entry_with_coeff_t
                  ((entry_with_coeff_t *)&local_48,(simplex_t)_index,
                   (int)(uVar17 + uVar19) + (int)uVar20,
                   iVar14 + (int)lVar18 + (int)uVar12 + (uint)CARRY8(uVar17,uVar19) +
                            (uint)CARRY8(uVar17 + uVar19,uVar20));
        (__return_storage_ptr__->
        super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
        )._M_payload.
        super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
        ._M_payload._M_value.
        super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::entry_with_coeff_t>
        .first = fVar25;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
                 ._M_payload + 0x10) = local_48;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
                 ._M_payload + 0x18) = uStack_40;
        iVar14 = 1;
        goto LAB_00135cc5;
      }
      uVar11 = ((uint)bVar1 + iVar14 + -1) * pBVar4->bits_per_vertex;
      bVar9 = (byte)uVar11;
      bVar10 = bVar9 & 0x3f;
      uVar23 = uVar20 << (bVar9 & 0x3f);
      bVar7 = (uVar11 & 0x40) != 0;
      uVar22 = lVar24 << bVar10 | uVar20 >> 0x40 - bVar10;
      if (bVar7) {
        uVar22 = uVar23;
      }
      uVar21 = 0;
      if (!bVar7) {
        uVar21 = uVar23;
      }
    }
    bVar7 = uVar19 < uVar21;
    uVar19 = uVar19 - uVar21;
    uVar12 = (uVar12 - uVar22) - (ulong)bVar7;
    *(ulong *)&this->idx_below = uVar19;
    *(ulong *)((long)&this->idx_below + 8) = uVar12;
    bVar7 = cVar16 == '\0';
    cVar16 = cVar16 + -1;
    if (bVar7) {
      uVar20 = 0;
      uVar22 = 1;
    }
    else {
      uVar11 = iVar8 * pBVar4->bits_per_vertex;
      bVar9 = (byte)uVar11;
      bVar10 = bVar9 & 0x3f;
      uVar21 = uVar20 << (bVar9 & 0x3f);
      bVar7 = (uVar11 & 0x40) != 0;
      uVar20 = lVar24 << bVar10 | uVar20 >> 0x40 - bVar10;
      if (bVar7) {
        uVar20 = uVar21;
      }
      uVar22 = 0;
      if (!bVar7) {
        uVar22 = uVar21;
      }
    }
    bVar7 = CARRY8(uVar17,uVar22);
    uVar17 = uVar17 + uVar22;
    lVar18 = lVar18 + uVar20 + (ulong)bVar7;
    *(ulong *)&this->idx_above = uVar17;
    *(long *)((long)&this->idx_above + 8) = lVar18;
    this->j = iVar2 + -1 + iVar14;
    this->k = (char)iVar14 + bVar1 + -1;
    iVar14 = iVar14 + -1;
    if (cVar16 == '\0') {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  } while( true );
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }